

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Palette.cpp
# Opt level: O3

void __thiscall
sfc::Palette::add_images
          (Palette *this,vector<sfc::Image,_std::allocator<sfc::Image>_> *palette_tiles)

{
  rgba_set_t *__x;
  uint uVar1;
  Mode MVar2;
  rgba_t rVar3;
  rgba_t *prVar4;
  FILE *f;
  rgba_t *prVar5;
  undefined8 uVar6;
  _Rb_tree_node_base *p_Var7;
  Subpalette *this_00;
  __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_> _Var8
  ;
  runtime_error *this_01;
  pointer pIVar9;
  ulong uVar10;
  pointer psVar11;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_>_2
  this_02;
  format_args args;
  string_view fmt;
  rgba_set_t sc;
  rgba_set_vec_t optimized;
  rgba_t local_dc;
  Palette *local_d8;
  pointer local_d0;
  rgba_t *local_c8;
  rgba_t *prStack_c0;
  _Base_ptr local_b8;
  _Rb_tree_node_base *local_b0;
  _Rb_tree_node_base *local_a8;
  pointer local_a0;
  undefined1 local_98 [16];
  pointer local_88;
  _Rb_tree_node_base *local_80;
  _Rb_tree_node_base *local_78;
  ulong local_70;
  ulong local_68;
  rgba_set_vec_t local_58;
  rgba_t *local_40;
  pointer local_38;
  
  local_58.
  super__Vector_base<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>,_std::allocator<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_58.
  super__Vector_base<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>,_std::allocator<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_58.
  super__Vector_base<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>,_std::allocator<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pIVar9 = (palette_tiles->super__Vector_base<sfc::Image,_std::allocator<sfc::Image>_>)._M_impl.
           super__Vector_impl_data._M_start;
  local_38 = (palette_tiles->super__Vector_base<sfc::Image,_std::allocator<sfc::Image>_>)._M_impl.
             super__Vector_impl_data._M_finish;
  local_d8 = this;
  if (pIVar9 != local_38) {
    local_40 = &this->_col0;
    do {
      __x = &pIVar9->_colors;
      local_d0 = pIVar9;
      std::
      _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
      ::_Rb_tree((_Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
                  *)local_98,&__x->_M_t);
      uVar10 = local_70;
      uVar1 = local_d8->_max_colors_per_subpalette;
      std::
      _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
      ::~_Rb_tree((_Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
                   *)local_98);
      this = local_d8;
      f = _stderr;
      if (uVar1 < uVar10) {
        std::
        _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
        ::_Rb_tree((_Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
                    *)&local_c8,&__x->_M_t);
        local_78 = (_Rb_tree_node_base *)(ulong)local_d0->_src_coord_x;
        local_68 = (ulong)local_d0->_src_coord_y;
        local_88 = (pointer)(ulong)this->_max_colors_per_subpalette;
        local_98._0_8_ = local_a0;
        args.field_1.values_ =
             (value<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> *)local_98;
        args.desc_ = 0x2224;
        fmt.size_ = 0x46;
        fmt.data_ = "  Tile with too many ({} > {}) unique colors at {},{} in source image\n";
        ::fmt::v10::vprint(f,fmt,args);
        std::
        _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
        ::~_Rb_tree((_Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
                     *)&local_c8);
      }
      if (this->_col0_is_shared == true) {
        std::
        _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
        ::_Rb_tree((_Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
                    *)local_98,&__x->_M_t);
        std::
        _Rb_tree<unsigned_int,unsigned_int,std::_Identity<unsigned_int>,std::less<unsigned_int>,std::allocator<unsigned_int>>
        ::_M_insert_unique<unsigned_int_const&>
                  ((_Rb_tree<unsigned_int,unsigned_int,std::_Identity<unsigned_int>,std::less<unsigned_int>,std::allocator<unsigned_int>>
                    *)local_98,local_40);
        MVar2 = this->_mode;
        local_b8 = (_Base_ptr)0x0;
        local_c8 = (rgba_t *)0x0;
        prStack_c0 = (rgba_t *)0x0;
        local_b0 = (_Rb_tree_node_base *)&prStack_c0;
        local_a0 = (pointer)0x0;
        local_a8 = local_b0;
        for (p_Var7 = local_80; p_Var7 != (_Rb_tree_node_base *)(local_98 + 8);
            p_Var7 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var7)) {
          local_dc = reduce_color(p_Var7[1]._M_color,MVar2);
          std::
          _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
          ::_M_insert_unique<unsigned_int>
                    ((_Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
                      *)&local_c8,&local_dc);
        }
        std::
        vector<std::set<unsigned_int,std::less<unsigned_int>,std::allocator<unsigned_int>>,std::allocator<std::set<unsigned_int,std::less<unsigned_int>,std::allocator<unsigned_int>>>>
        ::emplace_back<std::set<unsigned_int,std::less<unsigned_int>,std::allocator<unsigned_int>>>
                  ((vector<std::set<unsigned_int,std::less<unsigned_int>,std::allocator<unsigned_int>>,std::allocator<std::set<unsigned_int,std::less<unsigned_int>,std::allocator<unsigned_int>>>>
                    *)&local_58,
                   (set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> *)
                   &local_c8);
        std::
        _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
        ::~_Rb_tree((_Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
                     *)&local_c8);
        this_02.values_ =
             (value<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> *)local_98;
      }
      else {
        std::
        _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
        ::_Rb_tree((_Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
                    *)&local_c8,&__x->_M_t);
        MVar2 = this->_mode;
        local_88 = (pointer)0x0;
        local_98._0_8_ = (pointer)0x0;
        local_98._8_8_ = (pointer)0x0;
        local_80 = (_Rb_tree_node_base *)(local_98 + 8);
        local_70 = 0;
        local_78 = local_80;
        for (p_Var7 = local_b0; p_Var7 != (_Rb_tree_node_base *)&prStack_c0;
            p_Var7 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var7)) {
          local_dc = reduce_color(p_Var7[1]._M_color,MVar2);
          std::
          _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
          ::_M_insert_unique<unsigned_int>
                    ((_Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
                      *)local_98,&local_dc);
        }
        std::
        vector<std::set<unsigned_int,std::less<unsigned_int>,std::allocator<unsigned_int>>,std::allocator<std::set<unsigned_int,std::less<unsigned_int>,std::allocator<unsigned_int>>>>
        ::emplace_back<std::set<unsigned_int,std::less<unsigned_int>,std::allocator<unsigned_int>>>
                  ((vector<std::set<unsigned_int,std::less<unsigned_int>,std::allocator<unsigned_int>>,std::allocator<std::set<unsigned_int,std::less<unsigned_int>,std::allocator<unsigned_int>>>>
                    *)&local_58,
                   (set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> *)
                   local_98);
        std::
        _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
        ::~_Rb_tree((_Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
                     *)local_98);
        this_02.values_ =
             (value<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> *)&local_c8;
      }
      std::
      _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
      ::~_Rb_tree((_Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
                   *)this_02.values_);
      pIVar9 = local_d0 + 1;
    } while (pIVar9 != local_38);
  }
  optimized_palettes((rgba_set_vec_t *)local_98,this,&local_58);
  uVar6 = local_98._8_8_;
  uVar10 = ((long)(local_98._8_8_ - local_98._0_8_) >> 4) * -0x5555555555555555;
  if (this->_max_subpalettes <= uVar10 && uVar10 - this->_max_subpalettes != 0) {
    this_01 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error
              (this_01,"Colors in image do not fit in available palettes. Aborting.");
    __cxa_throw(this_01,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  if (local_98._0_8_ != local_98._8_8_) {
    psVar11 = (pointer)local_98._0_8_;
    do {
      this_00 = add_subpalette(this);
      std::vector<unsigned_int,std::allocator<unsigned_int>>::
      vector<std::_Rb_tree_const_iterator<unsigned_int>,void>
                ((vector<unsigned_int,std::allocator<unsigned_int>> *)&local_c8,
                 (psVar11->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left,
                 (_Rb_tree_const_iterator<unsigned_int>)
                 &(psVar11->_M_t)._M_impl.super__Rb_tree_header,(allocator_type *)&local_dc);
      prVar5 = prStack_c0;
      prVar4 = local_c8;
      this = local_d8;
      _Var8._M_current = prStack_c0;
      if (local_d8->_col0_is_shared == true) {
        local_dc = reduce_color(local_d8->_col0,local_d8->_mode);
        _Var8 = std::
                __find_if<__gnu_cxx::__normal_iterator<unsigned_int*,std::vector<unsigned_int,std::allocator<unsigned_int>>>,__gnu_cxx::__ops::_Iter_equals_val<unsigned_int_const>>
                          (prVar4,prVar5,(allocator_type *)&local_dc);
        this = local_d8;
        prVar4 = local_c8;
        if (_Var8._M_current != prStack_c0) {
          rVar3 = *_Var8._M_current;
          *_Var8._M_current = *local_c8;
          *local_c8 = rVar3;
          _Var8._M_current = prStack_c0;
        }
      }
      for (; local_d8 = this, prVar4 != _Var8._M_current; prVar4 = prVar4 + 1) {
        Subpalette::add(this_00,*prVar4,false);
        this = local_d8;
      }
      if (local_c8 != (rgba_t *)0x0) {
        operator_delete(local_c8,(long)local_b8 - (long)local_c8);
      }
      psVar11 = psVar11 + 1;
    } while (psVar11 != (pointer)uVar6);
  }
  std::
  vector<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>,_std::allocator<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>_>
  ::~vector((vector<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>,_std::allocator<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>_>
             *)local_98);
  std::
  vector<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>,_std::allocator<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>_>
  ::~vector(&local_58);
  return;
}

Assistant:

void Palette::add_images(std::vector<sfc::Image> palette_tiles) {

  // make vector of sets of all tiles' colors
  rgba_set_vec_t palettes = rgba_set_vec_t();
  for (const auto& c : palette_tiles) {

    if (c.colors().size() > _max_colors_per_subpalette) {
      fmt::print(stderr, "  Tile with too many ({} > {}) unique colors at {},{} in source image\n", c.colors().size(), _max_colors_per_subpalette, c.src_coord_x(), c.src_coord_y());
    }

    if (_col0_is_shared) {
      auto colors = c.colors();
      colors.insert(_col0);
      palettes.push_back(reduce_colors(colors, _mode));
    } else {
      palettes.push_back(reduce_colors(c.colors(), _mode));
    }
  }

  // optimize
  auto optimized = optimized_palettes(palettes);

  // TODO: if throw iterate all palette_tiles and report positions
  if (optimized.size() > _max_subpalettes)
    throw std::runtime_error("Colors in image do not fit in available palettes. Aborting.");

  // add subpalettes
  for (auto& cs : optimized) {
    auto& sp = add_subpalette();
    rgba_vec_t cv(cs.begin(), cs.end());

    if (_col0_is_shared) {
      auto p = std::find(cv.begin(), cv.end(), reduce_color(_col0, _mode));
      if (p != cv.end())
        std::iter_swap(p, cv.begin());
    }

    sp.add(cv);
  }
}